

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtPrintHexRev(FILE *pFile,word *pTruth,int nVars)

{
  char cVar1;
  int iVar2;
  int local_34;
  int local_2c;
  int StartK;
  int k;
  word *pThis;
  int nVars_local;
  word *pTruth_local;
  FILE *pFile_local;
  
  if (nVars < 6) {
    local_34 = 1 << ((char)nVars - 2U & 0x1f);
  }
  else {
    local_34 = 0x10;
  }
  if (nVars < 2) {
    __assert_fail("nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
  }
  iVar2 = Abc_TtWordNum(nVars);
  _StartK = pTruth + iVar2;
  while (_StartK = _StartK + -1, local_2c = local_34, pTruth <= _StartK) {
    while (local_2c = local_2c + -1, -1 < local_2c) {
      cVar1 = Abc_TtPrintDigit((uint)(*_StartK >> ((char)local_2c * '\x04' & 0x3fU)) & 0xf);
      fprintf((FILE *)pFile,"%c",(ulong)(uint)(int)cVar1);
    }
  }
  return;
}

Assistant:

static inline void Abc_TtPrintHexRev( FILE * pFile, word * pTruth, int nVars )
{
    word * pThis;
    int k, StartK = nVars >= 6 ? 16 : (1 << (nVars - 2));
    assert( nVars >= 2 );
    for ( pThis = pTruth + Abc_TtWordNum(nVars) - 1; pThis >= pTruth; pThis-- )
        for ( k = StartK - 1; k >= 0; k-- )
            fprintf( pFile, "%c", Abc_TtPrintDigit((int)(pThis[0] >> (k << 2)) & 15) );
//    printf( "\n" );
}